

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O1

libcaption_stauts_t caption_frame_decode_midrowchange(caption_frame_t *frame,uint16_t cc_data)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int unl;
  eia608_style_t sty;
  int chn;
  byte local_14 [4];
  undefined1 local_10 [4];
  int local_c;
  
  iVar3 = eia608_parse_midrowchange(cc_data,&local_c,(eia608_style_t *)local_10,(int *)local_14);
  if (iVar3 != 0) {
    bVar1 = *(byte *)&frame->state;
    bVar2 = local_10[0] * '\x02' & 0xe;
    *(byte *)&frame->state = bVar1 & 0xf1 | bVar2;
    *(byte *)&frame->state = bVar1 & 0xf0 | bVar2 | local_14[0] & 1;
  }
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t caption_frame_decode_midrowchange(caption_frame_t* frame, uint16_t cc_data)
{
    eia608_style_t sty;
    int chn, unl;

    if (eia608_parse_midrowchange(cc_data, &chn, &sty, &unl)) {
        frame->state.sty = sty;
        frame->state.uln = unl;
    }

    return LIBCAPTION_OK;
}